

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::handleBlockWithUnknownJump
          (RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> *this,RABlock *block)

{
  uint uVar1;
  BaseRAPass *pBVar2;
  RABlock *successor;
  Error EVar3;
  RABlock *pRVar4;
  RABlock **ppRVar5;
  size_t i;
  ulong i_00;
  
  pBVar2 = this->_pass;
  uVar1 = (pBVar2->_blocks).super_ZoneVectorBase._size;
  pRVar4 = RABlock::consecutive(block);
  for (i_00 = 1; i_00 < uVar1; i_00 = i_00 + 1) {
    ppRVar5 = ZoneVector<asmjit::_abi_1_10::RABlock_*>::operator[](&pBVar2->_blocks,i_00);
    successor = *ppRVar5;
    if ((successor != pRVar4) && ((successor->_flags & kIsTargetable) != kNone)) {
      RABlock::appendSuccessor(block,successor);
    }
  }
  EVar3 = shareAssignmentAcrossSuccessors(this,block);
  return EVar3;
}

Assistant:

Error handleBlockWithUnknownJump(RABlock* block) noexcept {
    RABlocks& blocks = _pass->blocks();
    size_t blockCount = blocks.size();

    // NOTE: Iterate from `1` as the first block is the entry block, we don't
    // allow the entry to be a successor of any block.
    RABlock* consecutive = block->consecutive();
    for (size_t i = 1; i < blockCount; i++) {
      RABlock* candidate = blocks[i];
      if (candidate == consecutive || !candidate->isTargetable())
        continue;
      block->appendSuccessor(candidate);
    }

    return shareAssignmentAcrossSuccessors(block);
  }